

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

BSSRDFHandle __thiscall
pbrt::SurfaceInteraction::GetBSSRDF
          (SurfaceInteraction *this,RayDifferential *ray,SampledWavelengths *lambda,
          CameraHandle *camera,ScratchBuffer *scratchBuffer)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  bool bVar3;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  TVar4;
  undefined8 in_RCX;
  long in_RSI;
  TaggedPointer<pbrt::TabulatedBSSRDF> in_RDI;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  in_R9;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  MixMaterial *mix;
  SurfaceInteraction *in_stack_fffffffffffffe38;
  MaterialEvalContext *in_stack_fffffffffffffe40;
  undefined1 local_130 [48];
  undefined1 auStack_100 [16];
  undefined1 auStack_f0 [48];
  undefined1 local_b8 [48];
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [48];
  MixMaterial local_40;
  undefined8 local_20;
  
  local_40.materials[1].
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           )(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             )in_R9.bits;
  local_20 = in_RCX;
  while( true ) {
    bVar3 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            ::Is<pbrt::MixMaterial>
                      ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                        *)in_stack_fffffffffffffe40);
    if (!bVar3) break;
    TVar4.bits = (uintptr_t)
                 TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                 ::CastOrNullptr<pbrt::MixMaterial>
                           ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                             *)in_stack_fffffffffffffe38);
    local_40.materials[0].
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             )(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
               )TVar4.bits;
    MaterialEvalContext::MaterialEvalContext(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    auVar5._48_16_ = auStack_88;
    auVar5._0_48_ = local_b8;
    auVar5 = vmovdqu64_avx512f(auVar5);
    auVar6._16_48_ = auStack_78;
    auVar6._0_16_ = auStack_88;
    auVar6 = vmovdqu64_avx512f(auVar6);
    vmovdqu64_avx512f(auVar6);
    auVar5 = vmovdqu64_avx512f(auVar5);
    in_stack_fffffffffffffe38 = auVar5._0_8_;
    in_stack_fffffffffffffe40 = auVar5._8_8_;
    MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>(&local_40,TVar4.bits);
    MaterialHandle::operator=
              ((MaterialHandle *)in_stack_fffffffffffffe40,
               (MaterialHandle *)in_stack_fffffffffffffe38);
  }
  MaterialEvalContext::MaterialEvalContext(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  auVar1._48_16_ = auStack_100;
  auVar1._0_48_ = local_130;
  auVar5 = vmovdqu64_avx512f(auVar1);
  auVar2._16_48_ = auStack_f0;
  auVar2._0_16_ = auStack_100;
  auVar6 = vmovdqu64_avx512f(auVar2);
  vmovdqu64_avx512f(auVar6);
  vmovdqu64_avx512f(auVar5);
  MaterialHandle::GetBSSRDF<pbrt::UniversalTextureEvaluator>
            ((MaterialHandle *)in_RDI.bits,in_RSI + 0xc0,local_20,
             local_40.materials[1].
             super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             .bits);
  return (BSSRDFHandle)(TaggedPointer<pbrt::TabulatedBSSRDF>)in_RDI.bits;
}

Assistant:

BSSRDFHandle SurfaceInteraction::GetBSSRDF(const RayDifferential &ray,
                                           SampledWavelengths &lambda,
                                           CameraHandle camera,
                                           ScratchBuffer &scratchBuffer) {
    while (material.Is<MixMaterial>()) {
        MixMaterial *mix = material.CastOrNullptr<MixMaterial>();
        material = mix->ChooseMaterial(UniversalTextureEvaluator(), *this);
    }
    return material.GetBSSRDF(UniversalTextureEvaluator(), *this, lambda, scratchBuffer);
}